

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string shader_source;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  TestShaderType local_64;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES> *local_40;
  undefined8 local_38;
  
  local_64 = tested_shader_type;
  local_40 = this;
  if (supported_variable_types_map._16_8_ != 0) {
    iVar1 = *(int *)Interface::ES::var_types;
    lVar7 = 0x21f1cb8;
    lVar2 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar2 + 0x20)) {
        lVar7 = lVar2;
      }
      lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < iVar1) * 8);
    } while (lVar2 != 0);
    if ((lVar7 != 0x21f1cb8) && (*(int *)(lVar7 + 0x20) <= iVar1)) {
      local_38 = 0;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,shader_start_abi_cxx11_,DAT_021ec698 + shader_start_abi_cxx11_)
      ;
      std::__cxx11::string::append((char *)&local_88);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_88,*(ulong *)(lVar7 + 0x28));
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_98 = *plVar6;
        lStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar6;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_50 = *plVar6;
        lStack_48 = plVar3[3];
        local_60 = &local_50;
      }
      else {
        local_50 = *plVar6;
        local_60 = (long *)*plVar3;
      }
      local_58 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::append((char *)&local_60);
      std::operator+(&local_88,"                x[0][i][j][k] = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar7 + 0x68));
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_98 = *plVar6;
        lStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar6;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::append((char *)&local_60);
      if (local_64 < SHADER_TYPE_LAST) {
        uVar8 = (ulong)local_64;
        puVar4 = &set_tesseation_abi_cxx11_;
        switch(uVar8) {
        case 1:
          std::__cxx11::string::append((char *)&local_60);
          break;
        case 3:
          puVar4 = &emit_quad_abi_cxx11_;
        case 4:
          std::__cxx11::string::_M_append((char *)&local_60,*puVar4);
        }
        std::__cxx11::string::_M_append((char *)&local_60,shader_end_abi_cxx11_);
        (*(code *)(&DAT_01ad34b8 + *(int *)(&DAT_01ad34b8 + uVar8 * 4)))();
        return;
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xbb1);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,3000);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsIndexingScalar1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start + "    " + var_iterator->second.type + " x[1][2][3][4];\n\n";

			shader_source += "    for (uint i = 0u; i < 2u; i++) {\n";
			shader_source += "        for (uint j = 0u; j < 3u; j++) {\n";
			shader_source += "            for (uint k = 0u; k < 4u; k++) {\n";
			shader_source += "                x[0][i][j][k] = " + var_iterator->second.initializer_with_ones + ";\n";
			shader_source += "            }\n";
			shader_source += "        }\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}